

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

void cmdq_release(void)

{
  long lVar1;
  
  cmd_tail = cmd_head;
  for (lVar1 = 0; lVar1 != 0xdc0; lVar1 = lVar1 + 0xb0) {
    cmd_release((command_conflict *)(cmd_queue[0].arg[0].name + lVar1 + -0x20));
  }
  cmd_release(&last_command);
  last_command.code = CMD_NULL;
  last_command_idx = L'\xffffffff';
  return;
}

Assistant:

void cmdq_release(void)
{
	int i;

	cmdq_flush();
	for (i = 0; i < CMD_QUEUE_SIZE; ++i) {
		cmd_release(cmd_queue + i);
	}
	cmd_release(&last_command);
	last_command.code = CMD_NULL;
	last_command_idx = -1;
}